

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O0

void __thiscall Connection_testWeight_Test::TestBody(Connection_testWeight_Test *this)

{
  bool bVar1;
  char *pcVar2;
  float fVar3;
  AssertHelper local_2a0;
  Message local_298;
  Connection local_290;
  int local_278 [2];
  undefined1 local_270 [8];
  AssertionResult gtest_ar_9;
  Message local_258;
  Connection local_250;
  int local_238 [2];
  undefined1 local_230 [8];
  AssertionResult gtest_ar_8;
  Message local_218;
  Connection local_210;
  int local_1f8 [2];
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_7;
  Message local_1d8;
  Connection local_1d0;
  int local_1b8 [2];
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_6;
  Message local_198;
  Connection local_190;
  int local_178 [2];
  undefined1 local_170 [8];
  AssertionResult gtest_ar_5;
  Message local_158;
  Connection local_150;
  int local_138 [2];
  undefined1 local_130 [8];
  AssertionResult gtest_ar_4;
  Message local_118;
  Connection local_110;
  int local_f8 [2];
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  Message local_d8;
  Connection local_d0;
  int local_b8 [2];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  Message local_98;
  Connection local_90;
  int local_78 [2];
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_58 [3];
  Connection local_40;
  int local_28 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  Connection_testWeight_Test *this_local;
  
  local_28[1] = 9;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  Connection::Connection(&local_40,(Neuron *)0x0,10.0,100.0,100.0);
  fVar3 = Connection::weight(&local_40);
  local_28[0] = (int)fVar3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_20,"9","int(Connection(0, 10).weight())",local_28 + 1,local_28
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x11,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_78[1] = 0x27;
  Connection::Connection(&local_90,(Neuron *)0x0,50.0,100.0,100.0);
  fVar3 = Connection::weight(&local_90);
  local_78[0] = (int)fVar3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_70,"39","int(Connection(0, 50).weight())",local_78 + 1,
             local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x12,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  local_b8[1] = 0xffffffd9;
  Connection::Connection(&local_d0,(Neuron *)0x0,-50.0,100.0,100.0);
  fVar3 = Connection::weight(&local_d0);
  local_b8[0] = (int)fVar3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_b0,"-39","int(Connection(0, -50).weight())",local_b8 + 1,
             local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x13,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_f8[1] = 0x3f;
  Connection::Connection(&local_110,(Neuron *)0x0,100.0,100.0,100.0);
  fVar3 = Connection::weight(&local_110);
  local_f8[0] = (int)fVar3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_f0,"63","int(Connection(0, 100).weight())",local_f8 + 1,
             local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_138[1] = 0xffffffc1;
  Connection::Connection(&local_150,(Neuron *)0x0,-100.0,100.0,100.0);
  fVar3 = Connection::weight(&local_150);
  local_138[0] = (int)fVar3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_130,"-63","int(Connection(0, -100).weight())",local_138 + 1,
             local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_178[1] = 100;
  Connection::Connection(&local_190,(Neuron *)0x0,10000.0,100.0,100.0);
  fVar3 = Connection::weight(&local_190);
  local_178[0] = (int)fVar3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_170,"100","int(Connection(0, 10000).weight())",local_178 + 1,
             local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x16,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_1b8[1] = 99;
  Connection::Connection(&local_1d0,(Neuron *)0x0,100.0,100.0,10.0);
  fVar3 = Connection::weight(&local_1d0);
  local_1b8[0] = (int)fVar3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_1b0,"99","int(Connection(0, 100, 100, 10).weight())",
             local_1b8 + 1,local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x17,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_1f8[1] = 0x56;
  Connection::Connection(&local_210,(Neuron *)0x0,100.0,100.0,50.0);
  fVar3 = Connection::weight(&local_210);
  local_1f8[0] = (int)fVar3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_1f0,"86","int(Connection(0, 100, 100, 50).weight())",
             local_1f8 + 1,local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_238[1] = 0x51;
  Connection::Connection(&local_250,(Neuron *)0x0,100.0,100.0,60.0);
  fVar3 = Connection::weight(&local_250);
  local_238[0] = (int)fVar3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_230,"81","int(Connection(0, 100, 100, 60).weight())",
             local_238 + 1,local_238);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x19,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  local_278[1] = 0x43;
  Connection::Connection(&local_290,(Neuron *)0x0,100.0,100.0,90.0);
  fVar3 = Connection::weight(&local_290);
  local_278[0] = (int)fVar3;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_270,"67","int(Connection(0, 100, 100, 90).weight())",
             local_278 + 1,local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  return;
}

Assistant:

TEST(Connection, testWeight)
{
    EXPECT_EQ(9, int(Connection(0, 10).weight()));
    EXPECT_EQ(39, int(Connection(0, 50).weight()));
    EXPECT_EQ(-39, int(Connection(0, -50).weight()));
    EXPECT_EQ(63, int(Connection(0, 100).weight()));
    EXPECT_EQ(-63, int(Connection(0, -100).weight()));
    EXPECT_EQ(100, int(Connection(0, 10000).weight()));
    EXPECT_EQ(99, int(Connection(0, 100, 100, 10).weight()));
    EXPECT_EQ(86, int(Connection(0, 100, 100, 50).weight()));
    EXPECT_EQ(81, int(Connection(0, 100, 100, 60).weight()));
    EXPECT_EQ(67, int(Connection(0, 100, 100, 90).weight()));
}